

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O2

void __thiscall
QOpenGLProgramBinaryCache::save(QOpenGLProgramBinaryCache *this,QByteArray *cacheKey,uint programId)

{
  QString *s1;
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  undefined1 *puVar4;
  quint32 *pqVar5;
  GLint GVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  QOpenGLContext *this_00;
  QOpenGLExtraFunctions *pQVar10;
  char *pcVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_120;
  QArrayDataPointer<char16_t> local_108;
  GLint outSize;
  quint32 blobFormat;
  quint32 *local_e0;
  QArrayDataPointer<char> local_d8;
  QArrayDataPointer<char16_t> local_b8;
  char *local_a0;
  GLint blobSize;
  GLEnvInfo info;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_cacheWritable != true) goto LAB_004da174;
  info.glversion.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  info.glversion.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  info.glversion.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  info.glrenderer.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  info.glrenderer.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  info.glvendor.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  info.glrenderer.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  info.glvendor.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  info.glvendor.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_19b94e7::GLEnvInfo::GLEnvInfo(&info);
  this_00 = QOpenGLContext::currentContext();
  pQVar10 = QOpenGLContext::extraFunctions(this_00);
  blobSize = 0;
  do {
    iVar8 = (*(((pQVar10->super_QOpenGLFunctions).d_ptr)->field_0).functions[0x17])();
    if (iVar8 == 0x507) break;
  } while (iVar8 != 0);
  (*(((pQVar10->super_QOpenGLFunctions).d_ptr)->field_0).functions[0x55])
            ((ulong)programId,0x8741,&blobSize);
  iVar8 = (int)info.glversion.d.size;
  iVar12 = (int)info.glvendor.d.size + (int)info.glrenderer.d.size;
  uVar15 = (long)((int)info.glversion.d.size + 0x27 + iVar12) & 0xfffffffffffffffc;
  uVar14 = (long)blobSize + uVar15;
  QtPrivateLogging::lcOpenGLProgramDiskCache();
  GVar6 = blobSize;
  if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
             _q_value._M_base._M_i & 1) != 0) {
    local_b8.d._0_4_ = 2;
    local_b8.size._4_4_ = 0;
    local_b8.d._4_4_ = 0;
    local_b8.ptr._0_4_ = 0;
    local_b8.ptr._4_4_ = 0;
    local_b8.size._0_4_ = 0;
    local_a0 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
    uVar9 = (*(((pQVar10->super_QOpenGLFunctions).d_ptr)->field_0).functions[0x17])();
    QMessageLogger::debug
              ((char *)&local_b8,"Program binary is %d bytes, err = 0x%x, total %d",
               (ulong)(uint)GVar6,(ulong)uVar9,uVar14 & 0xffffffff);
  }
  if (blobSize != 0) {
    iVar8 = ((int)uVar15 - (iVar12 + iVar8)) + -0x24;
    local_d8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_d8,uVar14,Uninitialized);
    pcVar11 = QByteArray::data((QByteArray *)&local_d8);
    pcVar11[0] = 't';
    pcVar11[1] = 'Q';
    pcVar11[2] = '\0';
    pcVar11[3] = '\0';
    pcVar11[4] = '\x03';
    pcVar11[5] = '\0';
    pcVar11[6] = '\0';
    pcVar11[7] = '\0';
    pcVar11[8] = '\0';
    pcVar11[9] = '\n';
    pcVar11[10] = '\x06';
    pcVar11[0xb] = '\0';
    pcVar11[0xc] = '\b';
    pcVar11[0xd] = '\0';
    pcVar11[0xe] = '\0';
    pcVar11[0xf] = '\0';
    local_e0 = (quint32 *)(pcVar11 + 0x10);
    writeStr((uchar **)&local_e0,&info.glvendor);
    writeStr((uchar **)&local_e0,&info.glrenderer);
    writeStr((uchar **)&local_e0,&info.glversion);
    pqVar5 = local_e0;
    blobFormat = 0;
    *local_e0 = 0;
    local_e0[1] = blobSize;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    for (lVar13 = 8; (int)lVar13 - iVar8 != 8; lVar13 = lVar13 + 1) {
      *(char *)((long)local_e0 + lVar13) = '\0';
    }
    outSize = 0;
    local_e0 = (quint32 *)(lVar13 + (long)local_e0);
    (*(pQVar10->super_QOpenGLFunctions).d_ptr[1].field_0.functions[0x60])
              ((ulong)programId,(ulong)(uint)blobSize,&outSize,&blobFormat);
    if (blobSize == outSize) {
      *pqVar5 = blobFormat;
      local_108.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_108.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_108.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      cacheFileName((QString *)&local_108,this,cacheKey);
      bVar7 = writeFile((QString *)&local_108,(QByteArray *)&local_d8);
      if (!bVar7) {
        s1 = &this->m_currentCacheDir;
        bVar7 = ::comparesEqual(s1,&this->m_globalCacheDir);
        if (bVar7) {
          QString::operator=(s1,(QString *)&this->m_localCacheDir);
          bVar7 = qt_ensureWritableDir(s1);
          this->m_cacheWritable = bVar7;
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug
                     ._q_value._M_base._M_i & 1) != 0) {
            local_b8.d._0_4_ = 2;
            local_b8.d._4_4_ = 0;
            local_b8.ptr._0_4_ = 0;
            local_b8.ptr._4_4_ = 0;
            local_b8.size._0_4_ = 0;
            local_b8.size._4_4_ = 0;
            local_a0 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
            QString::toLocal8Bit((QByteArray *)&local_120,s1);
            pcVar11 = local_120.ptr;
            if (local_120.ptr == (char *)0x0) {
              pcVar11 = (char *)&QByteArray::_empty;
            }
            QMessageLogger::debug
                      ((char *)&local_b8,"Cache location changed to \'%s\' writable = %d",pcVar11,
                       (ulong)this->m_cacheWritable);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_120);
          }
          if (this->m_cacheWritable != false) {
            cacheFileName((QString *)&local_b8,this,cacheKey);
            pDVar2 = (Data *)CONCAT44(local_b8.d._4_4_,local_b8.d._0_4_);
            pcVar3 = (char16_t *)CONCAT44(local_b8.ptr._4_4_,local_b8.ptr._0_4_);
            local_b8.d._0_4_ = SUB84(local_108.d,0);
            local_b8.d._4_4_ = (undefined4)((ulong)local_108.d >> 0x20);
            local_b8.ptr._0_4_ = SUB84(local_108.ptr,0);
            local_b8.ptr._4_4_ = (undefined4)((ulong)local_108.ptr >> 0x20);
            puVar4 = (undefined1 *)CONCAT44(local_b8.size._4_4_,(undefined4)local_b8.size);
            local_b8.size._0_4_ = (undefined4)local_108.size;
            local_b8.size._4_4_ = (undefined4)((ulong)local_108.size >> 0x20);
            local_108.d = pDVar2;
            local_108.ptr = pcVar3;
            local_108.size = (qsizetype)puVar4;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
            bVar7 = writeFile((QString *)&local_108,(QByteArray *)&local_d8);
            if (bVar7) goto LAB_004da105;
          }
        }
        QtPrivateLogging::lcOpenGLProgramDiskCache();
        if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                   _q_value._M_base._M_i & 1) != 0) {
          local_b8.d._0_4_ = 2;
          local_b8.d._4_4_ = 0;
          local_b8.ptr._0_4_ = 0;
          local_b8.ptr._4_4_ = 0;
          local_b8.size._0_4_ = 0;
          local_b8.size._4_4_ = 0;
          local_a0 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
          QString::toLocal8Bit((QByteArray *)&local_120,(QString *)&local_108);
          if (local_120.ptr == (char *)0x0) {
            local_120.ptr = (char *)&QByteArray::_empty;
          }
          QMessageLogger::debug
                    ((char *)&local_b8,"Failed to write %s to shader cache",local_120.ptr);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_120);
        }
      }
LAB_004da105:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    }
    else {
      QtPrivateLogging::lcOpenGLProgramDiskCache();
      if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                 _q_value._M_base._M_i & 1) != 0) {
        local_b8.d._0_4_ = 2;
        local_b8.size._4_4_ = 0;
        local_b8.d._4_4_ = 0;
        local_b8.ptr._0_4_ = 0;
        local_b8.ptr._4_4_ = 0;
        local_b8.size._0_4_ = 0;
        local_a0 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
        QMessageLogger::debug
                  ((char *)&local_b8,"glGetProgramBinary returned size %d instead of %d",
                   (ulong)(uint)outSize,(ulong)(uint)blobSize);
      }
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_d8);
  }
  anon_unknown.dwarf_19b94e7::GLEnvInfo::~GLEnvInfo(&info);
LAB_004da174:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLProgramBinaryCache::save(const QByteArray &cacheKey, uint programId)
{
    if (!m_cacheWritable)
        return;

    GLEnvInfo info;

    QOpenGLContext *context = QOpenGLContext::currentContext();
    QOpenGLExtraFunctions *funcs = context->extraFunctions();
    GLint blobSize = 0;
    while (true) {
        GLenum error = funcs->glGetError();
        if (error == GL_NO_ERROR || error == GL_CONTEXT_LOST)
            break;
    }
    funcs->glGetProgramiv(programId, GL_PROGRAM_BINARY_LENGTH, &blobSize);

    const int headerSize = FULL_HEADER_SIZE(info.glvendor.size() + info.glrenderer.size() + info.glversion.size());

    // Add padding to make the blob start 4-byte aligned in order to support
    // OpenGL implementations on ARM that choke on non-aligned pointers passed
    // to glProgramBinary.
    const int paddingSize = PADDING_SIZE(headerSize);

    const int totalSize = headerSize + paddingSize + blobSize;

    qCDebug(lcOpenGLProgramDiskCache, "Program binary is %d bytes, err = 0x%x, total %d", blobSize, funcs->glGetError(), totalSize);
    if (!blobSize)
        return;

    QByteArray blob(totalSize, Qt::Uninitialized);
    uchar *p = reinterpret_cast<uchar *>(blob.data());

    writeUInt(&p, BINSHADER_MAGIC);
    writeUInt(&p, BINSHADER_VERSION);
    writeUInt(&p, BINSHADER_QTVERSION);
    writeUInt(&p, sizeof(quintptr));

    writeStr(&p, info.glvendor);
    writeStr(&p, info.glrenderer);
    writeStr(&p, info.glversion);

    quint32 blobFormat = 0;
    uchar *blobFormatPtr = p;
    writeUInt(&p, blobFormat);
    writeUInt(&p, blobSize);

    for (int i = 0; i < paddingSize; ++i)
        *p++ = 0;

    GLint outSize = 0;
#if QT_CONFIG(opengles2)
    if (context->isOpenGLES() && context->format().majorVersion() < 3) {
        QMutexLocker lock(&m_mutex);
        initializeProgramBinaryOES(context);
        getProgramBinaryOES(programId, blobSize, &outSize, &blobFormat, p);
    } else
#endif
    funcs->glGetProgramBinary(programId, blobSize, &outSize, &blobFormat, p);
    if (blobSize != outSize) {
        qCDebug(lcOpenGLProgramDiskCache, "glGetProgramBinary returned size %d instead of %d", outSize, blobSize);
        return;
    }

    writeUInt(&blobFormatPtr, blobFormat);

    QString filename = cacheFileName(cacheKey);
    bool ok = writeFile(filename, blob);
    if (!ok && m_currentCacheDir == m_globalCacheDir) {
        m_currentCacheDir = m_localCacheDir;
        m_cacheWritable = qt_ensureWritableDir(m_currentCacheDir);
        qCDebug(lcOpenGLProgramDiskCache, "Cache location changed to '%s' writable = %d",
                qPrintable(m_currentCacheDir), m_cacheWritable);
        if (m_cacheWritable) {
            filename = cacheFileName(cacheKey);
            ok = writeFile(filename, blob);
        }
    }
    if (!ok)
        qCDebug(lcOpenGLProgramDiskCache, "Failed to write %s to shader cache", qPrintable(filename));
}